

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

int VP8InitFrame(VP8Decoder *dec,VP8Io *io)

{
  VP8FInfo *pVVar1;
  size_t __n;
  byte bVar2;
  int iVar3;
  WebPWorkerInterface *pWVar4;
  uint8_t *puVar5;
  VP8TopSamples *pVVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint8_t *puVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong nmemb;
  long lVar16;
  VP8FInfo *pVVar17;
  
  dec->cache_id_ = 0;
  if (dec->mt_method_ < 1) {
    uVar13 = 1;
    dec->num_caches_ = 1;
  }
  else {
    pWVar4 = WebPGetWorkerInterface();
    iVar3 = (*pWVar4->Reset)(&dec->worker_);
    if (iVar3 == 0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"thread initialization failed.");
      if (iVar3 == 0) {
        return 0;
      }
      uVar13 = dec->num_caches_;
    }
    else {
      (dec->worker_).data1 = dec;
      (dec->worker_).data2 = &(dec->thread_ctx_).io_;
      (dec->worker_).hook = FinishRow;
      uVar13 = 0 < dec->filter_type_ | 2;
      dec->num_caches_ = uVar13;
    }
  }
  iVar3 = dec->mb_w_;
  lVar8 = (long)iVar3;
  iVar11 = dec->filter_type_;
  iVar9 = dec->mt_method_;
  if ((long)iVar11 < 1) {
    lVar16 = 0;
  }
  else {
    lVar16 = (long)(iVar3 << (0 < iVar9)) << 2;
  }
  __n = lVar8 * 2 + 2;
  lVar15 = (long)(iVar3 << (iVar9 == 2)) * 800;
  bVar2 = ""[iVar11];
  lVar14 = (long)((int)((uVar13 * 0x10 + (uint)bVar2) * 3) / 2) * lVar8 * 0x20;
  if (dec->alpha_data_ == (uint8_t *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (ulong)(dec->pic_hdr_).height_ * (ulong)(dec->pic_hdr_).width_;
  }
  nmemb = lVar7 + lVar8 * 0x24 + __n + lVar16 + lVar15 + lVar14 + 0x35f;
  puVar5 = (uint8_t *)dec->mem_;
  if (dec->mem_size_ < nmemb) {
    WebPSafeFree(puVar5);
    dec->mem_size_ = 0;
    puVar5 = (uint8_t *)WebPSafeMalloc(nmemb,1);
    dec->mem_ = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"no memory during frame initialization.");
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_001058f1;
    }
    dec->mem_size_ = nmemb;
    iVar11 = dec->filter_type_;
    iVar9 = dec->mt_method_;
    bVar2 = ""[iVar11];
  }
  dec->intra_t_ = puVar5;
  pVVar6 = (VP8TopSamples *)(puVar5 + lVar8 * 4);
  dec->yuv_t_ = pVVar6;
  dec->mb_info_ = (VP8MB *)(pVVar6[lVar8].y + 2);
  pVVar1 = (VP8FInfo *)(pVVar6[lVar8].y + __n);
  pVVar17 = pVVar1;
  if (lVar16 == 0) {
    pVVar17 = (VP8FInfo *)0x0;
  }
  dec->f_info_ = pVVar17;
  (dec->thread_ctx_).id_ = 0;
  lVar12 = 0;
  if (0 < iVar9) {
    lVar12 = lVar8;
  }
  if (iVar11 < 1) {
    lVar12 = 0;
  }
  (dec->thread_ctx_).f_info_ = pVVar17 + lVar12;
  puVar5 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh_ + lVar16) & 0xffffffffffffffe0);
  dec->yuv_b_ = puVar5;
  dec->mb_data_ = (VP8MBData *)(puVar5 + 0x340);
  lVar16 = lVar8;
  if (iVar9 != 2) {
    lVar16 = 0;
  }
  (dec->thread_ctx_).mb_data_ = (VP8MBData *)(puVar5 + lVar16 * 800 + 0x340);
  lVar15 = lVar15 + 0x340;
  iVar11 = iVar3 * 0x10;
  dec->cache_y_stride_ = iVar11;
  iVar3 = iVar3 * 8;
  dec->cache_uv_stride_ = iVar3;
  puVar10 = puVar5 + (int)(iVar11 * (uint)bVar2) + lVar15;
  dec->cache_y_ = puVar10;
  lVar16 = (long)(int)((uint)(bVar2 >> 1) * iVar3);
  dec->cache_u_ = puVar10 + (int)(iVar11 * uVar13 * 0x10) + lVar16;
  dec->cache_v_ =
       puVar10 + (int)(iVar11 * uVar13 * 0x10) + lVar16 + (int)(uVar13 * iVar3 * 8) + lVar16;
  puVar5 = puVar5 + lVar14 + lVar15;
  dec->cache_id_ = 0;
  if (lVar7 == 0) {
    puVar5 = (uint8_t *)0x0;
  }
  dec->alpha_plane_ = puVar5;
  memset(pVVar6 + lVar8,0,__n);
  VP8InitScanline(dec);
  memset(dec->intra_t_,0,lVar8 * 4);
LAB_001058f1:
  io->mb_y = 0;
  puVar5 = dec->cache_u_;
  io->y = dec->cache_y_;
  io->u = puVar5;
  io->v = dec->cache_v_;
  iVar3 = dec->cache_uv_stride_;
  io->y_stride = dec->cache_y_stride_;
  io->uv_stride = iVar3;
  io->a = (uint8_t *)0x0;
  VP8DspInit();
  return 1;
}

Assistant:

int VP8InitFrame(VP8Decoder* const dec, VP8Io* const io) {
  if (!InitThreadContext(dec)) return 0;  // call first. Sets dec->num_caches_.
  if (!AllocateMemory(dec)) return 0;
  InitIo(dec, io);
  VP8DspInit();  // Init critical function pointers and look-up tables.
  return 1;
}